

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibrary.cpp
# Opt level: O2

void __thiscall deqp::sl::ShaderParser::parseValue(ShaderParser *this,ValueBlock *valueBlock)

{
  Token TVar1;
  undefined8 extraout_RAX;
  ShaderParser *this_00;
  ShaderParser *this_01;
  allocator<char> local_89;
  string local_88;
  Value result;
  
  result.valueName._M_dataplus._M_p = (pointer)&result.valueName.field_2;
  result.valueName._M_string_length = 0;
  result.valueName.field_2._M_local_buf[0] = '\0';
  result.elements.
  super__Vector_base<deqp::sl::ShaderCase::Value::Element,_std::allocator<deqp::sl::ShaderCase::Value::Element>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  result.elements.
  super__Vector_base<deqp::sl::ShaderCase::Value::Element,_std::allocator<deqp::sl::ShaderCase::Value::Element>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  result.elements.
  super__Vector_base<deqp::sl::ShaderCase::Value::Element,_std::allocator<deqp::sl::ShaderCase::Value::Element>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  TVar1 = this->m_curToken;
  if (TVar1 == TOKEN_OUTPUT) {
    result.storageType = STORAGE_OUTPUT;
  }
  else if (TVar1 == TOKEN_INPUT) {
    result.storageType = STORAGE_INPUT;
  }
  else {
    if (TVar1 != TOKEN_UNIFORM) goto LAB_00d694b8;
    result.storageType = STORAGE_UNIFORM;
  }
  this_01 = this;
  advanceToken(this);
  this_00 = (ShaderParser *)(ulong)this->m_curToken;
  result.dataType = mapDataTypeToken(this_01,this->m_curToken);
  if (result.dataType == TYPE_INVALID) {
LAB_00d69474:
    std::operator+(&local_88,"unexpected token when parsing value data type: ",&this->m_curTokenStr)
    ;
    parseError(this,&local_88);
  }
  else {
    advanceToken(this);
    if (this->m_curToken == TOKEN_STRING) {
      parseStringLiteral_abi_cxx11_(&local_88,this_00,(this->m_curTokenStr)._M_dataplus._M_p);
      std::__cxx11::string::operator=((string *)&result.valueName,(string *)&local_88);
      std::__cxx11::string::~string((string *)&local_88);
LAB_00d693a3:
      advanceToken(this);
      advanceToken(this,TOKEN_ASSIGN);
      if (this->m_curToken != TOKEN_LEFT_BRACKET) {
        parseValueElement(this,result.dataType,&result);
        result.arrayLength = 1;
LAB_00d69420:
        advanceToken(this,TOKEN_SEMI_COLON);
        std::vector<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>::
        push_back(&valueBlock->values,&result);
        ShaderCase::Value::~Value(&result);
        return;
      }
      advanceToken(this,TOKEN_LEFT_BRACKET);
      result.arrayLength = 0;
      while( true ) {
        parseValueElement(this,result.dataType,&result);
        result.arrayLength = result.arrayLength + 1;
        if (this->m_curToken != TOKEN_VERTICAL_BAR) break;
        advanceToken(this);
      }
      if (this->m_curToken == TOKEN_RIGHT_BRACKET) {
        advanceToken(this,TOKEN_RIGHT_BRACKET);
        goto LAB_00d69420;
      }
      std::operator+(&local_88,"unexpected token in value element array: ",&this->m_curTokenStr);
      parseError(this,&local_88);
      goto LAB_00d69474;
    }
    if (this->m_curToken == TOKEN_IDENTIFIER) {
      std::__cxx11::string::_M_assign((string *)&result.valueName);
      goto LAB_00d693a3;
    }
  }
  std::operator+(&local_88,"unexpected token when parsing value name: ",&this->m_curTokenStr);
  parseError(this,&local_88);
LAB_00d694b8:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"unexpected token encountered when parsing value classifier",
             &local_89);
  parseError(this,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  ShaderCase::Value::~Value(&result);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void ShaderParser::parseValue(ShaderCase::ValueBlock& valueBlock)
{
	PARSE_DBG(("      parseValue()\n"));

	// Parsed results.
	ShaderCase::Value result;

	// Parse storage.
	if (m_curToken == TOKEN_UNIFORM)
		result.storageType = ShaderCase::Value::STORAGE_UNIFORM;
	else if (m_curToken == TOKEN_INPUT)
		result.storageType = ShaderCase::Value::STORAGE_INPUT;
	else if (m_curToken == TOKEN_OUTPUT)
		result.storageType = ShaderCase::Value::STORAGE_OUTPUT;
	else
		parseError(string("unexpected token encountered when parsing value classifier"));
	advanceToken();

	// Parse data type.
	result.dataType = mapDataTypeToken(m_curToken);
	if (result.dataType == TYPE_INVALID)
		parseError(string("unexpected token when parsing value data type: " + m_curTokenStr));
	advanceToken();

	// Parse value name.
	if (m_curToken == TOKEN_IDENTIFIER || m_curToken == TOKEN_STRING)
	{
		if (m_curToken == TOKEN_IDENTIFIER)
			result.valueName = m_curTokenStr;
		else
			result.valueName = parseStringLiteral(m_curTokenStr.c_str());
	}
	else
		parseError(string("unexpected token when parsing value name: " + m_curTokenStr));
	advanceToken();

	// Parse assignment operator.
	advanceToken(TOKEN_ASSIGN);

	// Parse actual value.
	if (m_curToken == TOKEN_LEFT_BRACKET) // value list
	{
		advanceToken(TOKEN_LEFT_BRACKET);
		result.arrayLength = 0;

		for (;;)
		{
			parseValueElement(result.dataType, result);
			result.arrayLength++;

			if (m_curToken == TOKEN_RIGHT_BRACKET)
				break;
			else if (m_curToken == TOKEN_VERTICAL_BAR)
			{
				advanceToken();
				continue;
			}
			else
				parseError(string("unexpected token in value element array: " + m_curTokenStr));
		}

		advanceToken(TOKEN_RIGHT_BRACKET);
	}
	else // arrays, single elements
	{
		parseValueElement(result.dataType, result);
		result.arrayLength = 1;
	}

	advanceToken(TOKEN_SEMI_COLON); // end of declaration

	valueBlock.values.push_back(result);
}